

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::objectivec::ImportWriter::ProtoFrameworkCollector::ConsumeLine
          (ProtoFrameworkCollector *this,StringPiece *line,string *out_error)

{
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_01;
  stringpiece_ssize_type sVar1;
  iterator iVar2;
  ostream *poVar3;
  stringpiece_ssize_type sVar4;
  mapped_type *this_02;
  ulong len;
  size_type pos;
  int iVar5;
  StringPiece x;
  StringPiece proto_file_list;
  string local_a8;
  ulong local_88;
  StringPiece framework_name;
  string local_60;
  StringPiece proto_file;
  
  iVar5 = 0;
  sVar1 = StringPiece::find(line,':',0);
  len = (ulong)(int)sVar1;
  local_88 = len;
  if (len == 0xffffffffffffffff) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&framework_name,"Framework/proto file mapping line without colon sign: \'",
               (allocator<char> *)&proto_file);
    StringPiece::ToString_abi_cxx11_((string *)&proto_file_list,line);
    std::operator+(&local_a8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &framework_name,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &proto_file_list);
    std::operator+(&local_60,&local_a8,"\'.");
    std::__cxx11::string::operator=((string *)out_error,(string *)&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&proto_file_list);
    std::__cxx11::string::~string((string *)&framework_name);
  }
  else {
    StringPiece::StringPiece(&framework_name,*line,0,len);
    StringPiece::StringPiece
              (&proto_file_list,*line,(sVar1 << 0x20) + 0x100000000 >> 0x20,~len + line->length_);
    StringPieceTrimWhitespace(&framework_name);
    while (pos = (size_type)iVar5, (long)pos < proto_file_list.length_) {
      sVar1 = StringPiece::find(&proto_file_list,',',pos);
      if ((int)sVar1 == -1) {
        sVar1 = proto_file_list.length_;
      }
      x.length_ = proto_file_list.length_;
      x.ptr_ = proto_file_list.ptr_;
      StringPiece::StringPiece(&proto_file,x,pos,(long)((int)sVar1 - iVar5));
      StringPieceTrimWhitespace(&proto_file);
      if (proto_file.length_ != 0) {
        this_00 = &this->map_->_M_t;
        StringPiece::ToString_abi_cxx11_(&local_60,&proto_file);
        iVar2 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::find(this_00,&local_60);
        std::__cxx11::string::~string((string *)&local_60);
        if ((_Rb_tree_header *)iVar2._M_node != &(this->map_->_M_t)._M_impl.super__Rb_tree_header) {
          poVar3 = std::operator<<((ostream *)&std::cerr,
                                   "warning: duplicate proto file reference, replacing framework entry for \'"
                                  );
          StringPiece::ToString_abi_cxx11_(&local_60,&proto_file);
          poVar3 = std::operator<<(poVar3,(string *)&local_60);
          poVar3 = std::operator<<(poVar3,"\' with \'");
          StringPiece::ToString_abi_cxx11_(&local_a8,&framework_name);
          poVar3 = std::operator<<(poVar3,(string *)&local_a8);
          poVar3 = std::operator<<(poVar3,"\' (was \'");
          poVar3 = std::operator<<(poVar3,(string *)(iVar2._M_node + 2));
          poVar3 = std::operator<<(poVar3,"\').");
          std::endl<char,std::char_traits<char>>(poVar3);
          std::__cxx11::string::~string((string *)&local_a8);
          std::__cxx11::string::~string((string *)&local_60);
          std::ostream::flush();
        }
        sVar4 = StringPiece::find(&proto_file,' ',0);
        if (sVar4 != -1) {
          poVar3 = std::operator<<((ostream *)&std::cerr,
                                   "note: framework mapping file had a proto file with a space in, hopefully that isn\'t a missing comma: \'"
                                  );
          StringPiece::ToString_abi_cxx11_(&local_60,&proto_file);
          poVar3 = std::operator<<(poVar3,(string *)&local_60);
          poVar3 = std::operator<<(poVar3,"\'");
          std::endl<char,std::char_traits<char>>(poVar3);
          std::__cxx11::string::~string((string *)&local_60);
          std::ostream::flush();
        }
        StringPiece::ToString_abi_cxx11_(&local_60,&framework_name);
        this_01 = this->map_;
        StringPiece::ToString_abi_cxx11_(&local_a8,&proto_file);
        this_02 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](this_01,&local_a8);
        std::__cxx11::string::operator=((string *)this_02,(string *)&local_60);
        std::__cxx11::string::~string((string *)&local_a8);
        std::__cxx11::string::~string((string *)&local_60);
      }
      iVar5 = (int)sVar1 + 1;
    }
  }
  return local_88 != 0xffffffffffffffff;
}

Assistant:

bool ImportWriter::ProtoFrameworkCollector::ConsumeLine(
    const StringPiece& line, string* out_error) {
  int offset = line.find(':');
  if (offset == StringPiece::npos) {
    *out_error =
        string("Framework/proto file mapping line without colon sign: '") +
        line.ToString() + "'.";
    return false;
  }
  StringPiece framework_name(line, 0, offset);
  StringPiece proto_file_list(line, offset + 1, line.length() - offset - 1);
  StringPieceTrimWhitespace(&framework_name);

  int start = 0;
  while (start < proto_file_list.length()) {
    offset = proto_file_list.find(',', start);
    if (offset == StringPiece::npos) {
      offset = proto_file_list.length();
    }

    StringPiece proto_file(proto_file_list, start, offset - start);
    StringPieceTrimWhitespace(&proto_file);
    if (proto_file.size() != 0) {
      map<string, string>::iterator existing_entry =
          map_->find(proto_file.ToString());
      if (existing_entry != map_->end()) {
        cerr << "warning: duplicate proto file reference, replacing framework entry for '"
             << proto_file.ToString() << "' with '" << framework_name.ToString()
             << "' (was '" << existing_entry->second << "')." << endl;
        cerr.flush();
      }

      if (proto_file.find(' ') != StringPiece::npos) {
        cerr << "note: framework mapping file had a proto file with a space in, hopefully that isn't a missing comma: '"
             << proto_file.ToString() << "'" << endl;
        cerr.flush();
      }

      (*map_)[proto_file.ToString()] = framework_name.ToString();
    }

    start = offset + 1;
  }

  return true;
}